

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# measunit.cpp
# Opt level: O0

int32_t icu_63::binarySearch(char **array,int32_t start,int32_t end,char *key)

{
  int iVar1;
  int iVar2;
  int32_t cmp;
  int32_t mid;
  char *key_local;
  int32_t end_local;
  int32_t start_local;
  char **array_local;
  
  key_local._0_4_ = end;
  key_local._4_4_ = start;
  do {
    while( true ) {
      if ((int32_t)key_local <= key_local._4_4_) {
        return -1;
      }
      iVar1 = (key_local._4_4_ + (int32_t)key_local) / 2;
      iVar2 = strcmp(array[iVar1],key);
      if (-1 < iVar2) break;
      key_local._4_4_ = iVar1 + 1;
    }
    key_local._0_4_ = iVar1;
  } while (iVar2 != 0);
  return iVar1;
}

Assistant:

static int32_t binarySearch(
        const char * const * array, int32_t start, int32_t end, const char * key) {
    while (start < end) {
        int32_t mid = (start + end) / 2;
        int32_t cmp = uprv_strcmp(array[mid], key);
        if (cmp < 0) {
            start = mid + 1;
            continue;
        }
        if (cmp == 0) {
            return mid;
        }
        end = mid;
    }
    return -1;
}